

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlSAXParseFileWithData(xmlSAXHandlerPtr sax,char *filename,int recovery,void *data)

{
  xmlParserCtxtPtr ctxt_00;
  char *pcVar1;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr ret;
  void *data_local;
  int recovery_local;
  char *filename_local;
  xmlSAXHandlerPtr sax_local;
  
  xmlInitParser();
  ctxt_00 = xmlCreateFileParserCtxt(filename);
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    if (sax != (xmlSAXHandlerPtr)0x0) {
      if (ctxt_00->sax != (_xmlSAXHandler *)0x0) {
        (*xmlFree)(ctxt_00->sax);
      }
      ctxt_00->sax = sax;
    }
    xmlDetectSAX2(ctxt_00);
    if (data != (void *)0x0) {
      ctxt_00->_private = data;
    }
    if (ctxt_00->directory == (char *)0x0) {
      pcVar1 = xmlParserGetDirectory(filename);
      ctxt_00->directory = pcVar1;
    }
    ctxt_00->recovery = recovery;
    xmlParseDocument(ctxt_00);
    if ((ctxt_00->wellFormed == 0) && (recovery == 0)) {
      ctxt = (xmlParserCtxtPtr)0x0;
      xmlFreeDoc(ctxt_00->myDoc);
      ctxt_00->myDoc = (xmlDocPtr)0x0;
    }
    else {
      ctxt = (xmlParserCtxtPtr)ctxt_00->myDoc;
      if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt_00->input->buf != (xmlParserInputBufferPtr)0x0))
      {
        if (ctxt_00->input->buf->compressed < 1) {
          *(int *)&ctxt->inputTab = ctxt_00->input->buf->compressed;
        }
        else {
          *(int *)&ctxt->inputTab = 9;
        }
      }
    }
    if (sax != (xmlSAXHandlerPtr)0x0) {
      ctxt_00->sax = (_xmlSAXHandler *)0x0;
    }
    xmlFreeParserCtxt(ctxt_00);
    sax_local = (xmlSAXHandlerPtr)ctxt;
  }
  return (xmlDocPtr)sax_local;
}

Assistant:

xmlDocPtr
xmlSAXParseFileWithData(xmlSAXHandlerPtr sax, const char *filename,
                        int recovery, void *data) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;

    xmlInitParser();

    ctxt = xmlCreateFileParserCtxt(filename);
    if (ctxt == NULL) {
	return(NULL);
    }
    if (sax != NULL) {
	if (ctxt->sax != NULL)
	    xmlFree(ctxt->sax);
        ctxt->sax = sax;
    }
    xmlDetectSAX2(ctxt);
    if (data!=NULL) {
	ctxt->_private = data;
    }

    if (ctxt->directory == NULL)
        ctxt->directory = xmlParserGetDirectory(filename);

    ctxt->recovery = recovery;

    xmlParseDocument(ctxt);

    if ((ctxt->wellFormed) || recovery) {
        ret = ctxt->myDoc;
	if ((ret != NULL) && (ctxt->input->buf != NULL)) {
	    if (ctxt->input->buf->compressed > 0)
		ret->compression = 9;
	    else
		ret->compression = ctxt->input->buf->compressed;
	}
    }
    else {
       ret = NULL;
       xmlFreeDoc(ctxt->myDoc);
       ctxt->myDoc = NULL;
    }
    if (sax != NULL)
        ctxt->sax = NULL;
    xmlFreeParserCtxt(ctxt);

    return(ret);
}